

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

void __thiscall QDialogButtonBoxPrivate::layoutButtons(QDialogButtonBoxPrivate *this)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  QWidget *this_00;
  QWidget *second;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long *plVar9;
  QWidget *pQVar10;
  uint *puVar11;
  parameter_type t;
  iterator iVar12;
  iterator iVar13;
  long lVar14;
  int i;
  ButtonLayout BVar15;
  QList<QAbstractButton_*> *buttonList;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar2 = this->ignoreShowAndHide;
  this->ignoreShowAndHide = true;
  iVar6 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))();
  while (0 < iVar6) {
    iVar6 = iVar6 + -1;
    plVar9 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xb0))
                               (this->buttonLayout,iVar6);
    pQVar10 = (QWidget *)(**(code **)(*plVar9 + 0x68))(plVar9);
    if (pQVar10 != (QWidget *)0x0) {
      QWidget::hide(pQVar10);
    }
    (**(code **)(*plVar9 + 8))(plVar9);
  }
  BVar15 = this->layoutPolicy;
  if (BVar15 == MacLayout) {
    lVar14 = 0;
    BVar15 = AndroidLayout;
    do {
      if (lVar14 == 0x14) goto LAB_004343df;
      piVar1 = (int *)((long)layoutButtons::ModalRoles + lVar14);
      lVar14 = lVar14 + 4;
    } while (this->buttonLists[*piVar1].d.size == 0);
    BVar15 = MacLayout;
  }
LAB_004343df:
  puVar11 = (uint *)QPlatformDialogHelper::buttonLayout(this->orientation,BVar15);
  if (this->center == true) {
    QBoxLayout::addStretch(this->buttonLayout,0);
  }
  do {
    uVar3 = *puVar11;
    if (uVar3 == 0xffffffff) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (QWidget **)0x0;
      local_58.size = 0;
      for (iVar6 = 0; iVar8 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))(),
          iVar6 < iVar8; iVar6 = iVar6 + 1) {
        plVar9 = (long *)(**(code **)(*(long *)&this->buttonLayout->super_QLayout + 0xa8))();
        t = (parameter_type)(**(code **)(*plVar9 + 0x68))(plVar9);
        if (t != (parameter_type)0x0) {
          QList<QWidget_*>::append((QList<QWidget_*> *)&local_58,t);
        }
      }
      QWidget::setFocusProxy(this_00,(QWidget *)0x0);
      if (local_58.size != 0) {
        pQVar10 = local_58.ptr[local_58.size + -1];
        iVar12 = QList<QWidget_*>::begin((QList<QWidget_*> *)&local_58);
        iVar13 = QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
        for (; iVar12.i != iVar13.i; iVar12.i = iVar12.i + 1) {
          second = *iVar12.i;
          QWidget::setTabOrder(pQVar10,second);
          pQVar10 = (QWidget *)
                    QtPrivate::qobject_cast_helper<QPushButton*,QObject>(&second->super_QObject);
          if ((pQVar10 != (QWidget *)0x0) &&
             (bVar5 = QPushButton::isDefault((QPushButton *)pQVar10), bVar5)) {
            QWidget::setFocusProxy(this_00,pQVar10);
          }
          pQVar10 = second;
        }
      }
      if (this->center == true) {
        QBoxLayout::addStretch(this->buttonLayout,0);
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
      this->ignoreShowAndHide = bVar2;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    uVar7 = uVar3 & 0xbfffffff;
    bVar4 = (byte)(uVar3 >> 0x18);
    switch((ulong)uVar7) {
    case 0:
      if (this->buttonLists[0].d.size != 0) {
        pQVar10 = &(*this->buttonLists[0].d.ptr)->super_QWidget;
        QBoxLayout::addWidget(this->buttonLayout,pQVar10,0,(Alignment)0x0);
        QWidget::show(pQVar10);
      }
      break;
    case 1:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
      buttonList = this->buttonLists + uVar7;
LAB_00434463:
      addButtonsToLayout(this,buttonList,(bool)(bVar4 >> 6 & 1));
      break;
    case 2:
      buttonList = this->buttonLists + 2;
      if (BVar15 != MacLayout) goto LAB_00434463;
      if ((this->buttonLists[2].d.size != 0) &&
         (iVar6 = (**(code **)(*(long *)&this->buttonLayout->super_QLayout + 200))(), 1 < iVar6)) {
        QBoxLayout::addSpacing(this->buttonLayout,0x1c);
      }
      addButtonsToLayout(this,this->buttonLists + 2,(bool)(bVar4 >> 6 & 1));
      if (this->buttonLists[2].d.size != 0) {
        QBoxLayout::addSpacing(this->buttonLayout,0x1c);
      }
      break;
    default:
      if (uVar7 == 0x10000000) {
        if (1 < (ulong)this->buttonLists[0].d.size) {
          QList<QAbstractButton_*>::mid
                    ((QList<QAbstractButton_*> *)&local_58,this->buttonLists,1,-1);
          addButtonsToLayout(this,(QList<QAbstractButton_*> *)&local_58,(bool)(bVar4 >> 6 & 1));
          QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer
                    ((QArrayDataPointer<QAbstractButton_*> *)&local_58);
        }
      }
      else if ((uVar7 == 0x20000000) && (this->center == false)) {
        QBoxLayout::addStretch(this->buttonLayout,0);
      }
    }
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

void QDialogButtonBoxPrivate::layoutButtons()
{
    Q_Q(QDialogButtonBox);
    const int MacGap = 36 - 8;    // 8 is the default gap between a widget and a spacer item

    QScopedValueRollback blocker(ignoreShowAndHide, true);
    for (int i = buttonLayout->count() - 1; i >= 0; --i) {
        QLayoutItem *item = buttonLayout->takeAt(i);
        if (QWidget *widget = item->widget())
            widget->hide();
        delete item;
    }

    int tmpPolicy = layoutPolicy;

    static const int M = 5;
    static const int ModalRoles[M] = { QPlatformDialogHelper::AcceptRole, QPlatformDialogHelper::RejectRole,
        QPlatformDialogHelper::DestructiveRole, QPlatformDialogHelper::YesRole, QPlatformDialogHelper::NoRole };
    if (tmpPolicy == QDialogButtonBox::MacLayout) {
        bool hasModalButton = false;
        for (int i = 0; i < M; ++i) {
            if (!buttonLists[ModalRoles[i]].isEmpty()) {
                hasModalButton = true;
                break;
            }
        }
        if (!hasModalButton)
            tmpPolicy = 4;  // Mac modeless
    }

    const int *currentLayout = QPlatformDialogHelper::buttonLayout(
        orientation, static_cast<QPlatformDialogHelper::ButtonLayout>(tmpPolicy));

    if (center)
        buttonLayout->addStretch();

    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QPlatformDialogHelper::AcceptRole];

    while (*currentLayout != QPlatformDialogHelper::EOL) {
        int role = (*currentLayout & ~QPlatformDialogHelper::Reverse);
        bool reverse = (*currentLayout & QPlatformDialogHelper::Reverse);

        switch (role) {
        case QPlatformDialogHelper::Stretch:
            if (!center)
                buttonLayout->addStretch();
            break;
        case QPlatformDialogHelper::AcceptRole: {
            if (acceptRoleList.isEmpty())
                break;
            // Only the first one
            QAbstractButton *button = acceptRoleList.first();
            buttonLayout->addWidget(button);
            button->show();
        }
            break;
        case QPlatformDialogHelper::AlternateRole:
            if (acceptRoleList.size() > 1)
                addButtonsToLayout(acceptRoleList.mid(1), reverse);
            break;
        case QPlatformDialogHelper::DestructiveRole:
            {
                const QList<QAbstractButton *> &list = buttonLists[role];

                /*
                    Mac: Insert a gap on the left of the destructive
                    buttons to ensure that they don't get too close to
                    the help and action buttons (but only if there are
                    some buttons to the left of the destructive buttons
                    (and the stretch, whence buttonLayout->count() > 1
                    and not 0)).
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout
                        && !list.isEmpty() && buttonLayout->count() > 1)
                    buttonLayout->addSpacing(MacGap);

                addButtonsToLayout(list, reverse);

                /*
                    Insert a gap between the destructive buttons and the
                    accept and reject buttons.
                */
                if (tmpPolicy == QDialogButtonBox::MacLayout && !list.isEmpty())
                    buttonLayout->addSpacing(MacGap);
            }
            break;
        case QPlatformDialogHelper::RejectRole:
        case QPlatformDialogHelper::ActionRole:
        case QPlatformDialogHelper::HelpRole:
        case QPlatformDialogHelper::YesRole:
        case QPlatformDialogHelper::NoRole:
        case QPlatformDialogHelper::ApplyRole:
        case QPlatformDialogHelper::ResetRole:
            addButtonsToLayout(buttonLists[role], reverse);
        }
        ++currentLayout;
    }

    QWidgetList layoutWidgets;
    for (int i = 0; i < buttonLayout->count(); ++i) {
        if (auto *widget = buttonLayout->itemAt(i)->widget())
            layoutWidgets << widget;
    }

    q->setFocusProxy(nullptr);
    if (!layoutWidgets.isEmpty()) {
        QWidget *prev = layoutWidgets.constLast();
        for (QWidget *here : layoutWidgets) {
            QWidget::setTabOrder(prev, here);
            prev = here;
            if (auto *pushButton = qobject_cast<QPushButton *>(prev); pushButton && pushButton->isDefault())
                q->setFocusProxy(pushButton);
        }
    }

    if (center)
        buttonLayout->addStretch();
}